

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O2

double __thiscall
lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::
optimizeStep(HungarianBranching<lineage::heuristics::PartitionGraph> *this,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *first,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *second,bool mark_solution)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  unsigned_long uVar5;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  runtime_error *prVar7;
  pointer pVVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  pointer pAVar12;
  size_t sVar13;
  pointer pIVar14;
  size_t col;
  bool bVar15;
  double dVar16;
  pair<bool,_unsigned_long> pVar17;
  _Vector_base<int,_std::allocator<int>_> local_1c8;
  long local_1b0;
  long local_1a8;
  size_t local_1a0;
  size_t local_198;
  size_t local_190;
  _Vector_base<double,_std::allocator<double>_> local_188;
  vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  matches;
  cost_t original_costs;
  anon_class_24_3_d1c0cc24 setCost;
  bipartite_graph_t bigraph;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  matcher;
  
  lVar4 = (long)(first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_1a8 = lVar4 >> 3;
  lVar4 = lVar4 >> 2;
  lVar11 = (long)(second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  lVar1 = lVar11 + lVar4;
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Digraph
            (&bigraph,lVar1 * 2,(Visitor *)&matcher);
  setCost.costs = (cost_t *)&local_188;
  local_188._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  setCost.mask = (mask_t *)&local_1c8;
  local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0 = lVar11 + lVar1;
  setCost.bigraph = &bigraph;
  for (uVar9 = 0; lVar11 = local_1b0,
      puVar2 = (first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar9 < (ulong)((long)(first->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3);
      uVar9 = uVar9 + 1) {
    sVar13 = local_1b0 + uVar9;
    dVar16 = PartitionGraph::terminationCosts
                       ((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_
                        ,puVar2[uVar9]);
    local_198 = sVar13;
    optimizeStep::anon_class_24_3_d1c0cc24::operator()(&setCost,uVar9,sVar13,dVar16);
    local_190 = local_1a8 + uVar9;
    local_1a0 = lVar11 + local_190;
    optimizeStep::anon_class_24_3_d1c0cc24::operator()(&setCost,local_190,local_1a0,0.0);
    uVar5 = puVar2[uVar9];
    pVVar8 = (((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_)->
             super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pAVar12 = *(pointer *)&((Adjacencies *)((long)(pVVar8 + uVar5) + 0x20))->vector_;
        pAVar12 != *(pointer *)((long)(pVVar8 + uVar5) + 0x28); pAVar12 = pAVar12 + 1) {
      matcher.graph_ = (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)pAVar12->vertex_;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                        ((second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_start,
                         (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_finish,&matcher);
      if (_Var6._M_current !=
          (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar3 = (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        pVar17 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                           (&((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).
                             graph_)->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>
                            ,puVar2[uVar9],(size_t)matcher.graph_);
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"Could not find edge (A, B)!");
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        dVar16 = PartitionGraph::costOfEdge
                           ((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).
                            graph_,pVar17.second);
        lVar11 = (long)_Var6._M_current - (long)puVar3 >> 3;
        sVar13 = lVar11 + lVar1;
        optimizeStep::anon_class_24_3_d1c0cc24::operator()(&setCost,uVar9,sVar13,dVar16);
        optimizeStep::anon_class_24_3_d1c0cc24::operator()(&setCost,local_190,sVar13,dVar16);
        sVar13 = lVar11 + lVar4;
        optimizeStep::anon_class_24_3_d1c0cc24::operator()(&setCost,sVar13,local_198,0.0);
        optimizeStep::anon_class_24_3_d1c0cc24::operator()(&setCost,sVar13,local_1a0,0.0);
      }
      uVar5 = puVar2[uVar9];
      pVVar8 = (((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_)->
               super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  for (uVar9 = 0;
      puVar2 = (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar9 < (ulong)((long)(second->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3);
      uVar9 = uVar9 + 1) {
    dVar16 = PartitionGraph::birthCosts
                       ((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_
                        ,puVar2[uVar9]);
    optimizeStep::anon_class_24_3_d1c0cc24::operator()(&setCost,lVar4 + uVar9,lVar1 + uVar9,dVar16);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&original_costs,(vector<double,_std::allocator<double>_> *)&local_188);
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::Matching(&matcher,&bigraph,(vector<double,_std::allocator<double>_> *)&local_188,
             (vector<int,_std::allocator<int>_> *)&local_1c8);
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::run(&matcher);
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::matches(&matches,&matcher);
  dVar16 = 0.0;
  for (lVar4 = 0;
      (long)local_1c8._M_impl.super__Vector_impl_data._M_finish -
      (long)local_1c8._M_impl.super__Vector_impl_data._M_start >> 2 != lVar4; lVar4 = lVar4 + 1) {
    if (local_1c8._M_impl.super__Vector_impl_data._M_start[lVar4] == 1) {
      dVar16 = dVar16 + original_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4];
    }
  }
  pIVar14 = matches.
            super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (mark_solution) {
    for (; pIVar14 !=
           matches.
           super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
           ._M_impl.super__Vector_impl_data._M_finish; pIVar14 = pIVar14 + 1) {
      puVar2 = (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pIVar14->col <
          (ulong)(((long)(second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) + lVar1)) {
        uVar9 = pIVar14->row;
        puVar3 = (first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar4 = (long)(first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
        uVar10 = lVar4 >> 3;
        if ((uVar9 < uVar10) ||
           (bVar15 = uVar9 < (ulong)(lVar4 >> 2), uVar9 = uVar9 - uVar10, bVar15)) {
          pVar17 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                             (&((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>
                                ).graph_)->
                               super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,
                              puVar3[uVar9],puVar2[pIVar14->col - lVar1]);
          if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar7,"Could not find matched edge!");
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          (this->solution_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[pVar17.second] = '\x01';
        }
      }
    }
  }
  std::
  _Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  ::~_Vector_base(&matches.
                   super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                 );
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::~Matching(&matcher);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&original_costs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1c8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_188);
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::~Digraph(&bigraph);
  return dVar16;
}

Assistant:

inline double
HungarianBranching<GRAPH>::optimizeStep(std::vector<size_t> const& first,
                                        std::vector<size_t> const& second,
                                        bool mark_solution)
{
    // setup cost for matching.
    const size_t n_rows = 2 * first.size() + second.size();
    const size_t n_cols = n_rows;

    // lookup for auxiliary nodes.
    const size_t first_size = first.size();
    const size_t second_size = second.size();
    auto idxOfRow = [=](size_t row) { return row; };
    auto idxOfDuplicateRow = [=](size_t row) { return first_size + row; };
    auto idxOfBirthRow = [=](size_t col) { return 2 * first_size + col; };
    auto idxOfCol = [=](size_t col) { return n_rows + col; };
    auto idxOfTerminationCol = [=](size_t row) {
        return n_rows + second_size + row;
    };

    // construct auxiliary graph for matching.
    auto bigraph = bipartite_graph_t(n_rows + n_cols);
    auto costs = cost_t();
    auto mask = mask_t();

    auto setCost = [&](size_t row, size_t col, double val) {
        bigraph.insertEdge(row, col);
        costs.emplace_back(val);
        mask.emplace_back(0);
    };

    for (size_t row = 0; row < first.size(); ++row) {

        auto const& partitionIdA = first[row];

        // termination costs.

        setCost(idxOfRow(row), idxOfTerminationCol(row),
                this->graph_.terminationCosts(partitionIdA));
        setCost(idxOfDuplicateRow(row),
                idxOfTerminationCol(idxOfDuplicateRow(row)), .0);

        for (auto it = this->graph_.verticesFromVertexBegin(partitionIdA);
             it != this->graph_.verticesFromVertexEnd(partitionIdA); ++it) {
            auto const& partitionIdB = *it;

            const auto pos =
                std::find(second.cbegin(), second.cend(), partitionIdB);
            if (pos == second.cend()) { // if maxDistance is limited, then it
                                        // might be that the edge is not found.
                continue;
                // throw std::runtime_error(
                //        "Could not find neighbouring partition in frame
                //        t+1!");
            }
            const auto col = std::distance(second.cbegin(), pos);

            const auto p = this->graph_.findEdge(partitionIdA, partitionIdB);
            if (!p.first)
                throw std::runtime_error("Could not find edge (A, B)!");

            auto const& coeff = this->graph_.costOfEdge(p.second);

            setCost(idxOfRow(row), idxOfCol(col), coeff);
            setCost(idxOfDuplicateRow(row), idxOfCol(col), coeff);

            // auxiliary edges.
            setCost(idxOfBirthRow(col), idxOfTerminationCol(row), .0);
            setCost(idxOfBirthRow(col),
                    idxOfTerminationCol(idxOfDuplicateRow(row)), .0);
        }
    }

    // birth costs.
    for (size_t col = 0; col < second.size(); ++col) {
        auto const& partitionIdB = second[col];
        setCost(idxOfBirthRow(col), idxOfCol(col),
                this->graph_.birthCosts(partitionIdB));
    }

    // Matching modifies the costs of the given vector, so we make a copy for
    // objective calculation later on.
    auto const original_costs = costs;

    auto matcher =
        markurem::matching::Matching<bipartite_graph_t, cost_t, mask_t>(
            bigraph, costs, mask);
    matcher.run();

    // calculate objective and mark edges.
    double objective = .0;
    auto const matches = matcher.matches();

    for (size_t idx = 0; idx < mask.size(); ++idx)
        if (mask[idx] == 1)
            objective += original_costs[idx];

    if (mark_solution) {
        for (auto const& match : matches) {
            // if the match involves to original nodes, then
            // mark the edge as matched in the solution.
            size_t partitionIdA, partitionIdB;
            if (match.col >= second.size() + n_rows)
                continue;
            else
                partitionIdB = second[match.col - n_rows];

            if (match.row < first.size())
                partitionIdA = first[match.row];
            else if (match.row < 2 * first.size())
                partitionIdA = first[match.row - first.size()];
            else
                continue;

            auto p = this->graph_.findEdge(partitionIdA, partitionIdB);
            if (!p.first)
                throw std::runtime_error("Could not find matched edge!");

            solution_[p.second] = true;
        }
    }

    return objective;
}